

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O2

void msd_A_adaptive(uchar **strings,size_t N)

{
  cacheblock_t *cache;
  uchar **ppuVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  
  cache = (cacheblock_t *)malloc(N << 4);
  ppuVar1 = &cache->ptr;
  for (sVar3 = 0; N != sVar3; sVar3 = sVar3 + 1) {
    *ppuVar1 = strings[sVar3];
    ppuVar1 = ppuVar1 + 2;
  }
  fill_cache(cache,N,0);
  msd_A_adaptive(cache,N,0,0);
  lVar2 = 4;
  while (bVar4 = N != 0, N = N - 1, bVar4) {
    *(undefined8 *)((long)strings + lVar2 + -4) = *(undefined8 *)(cache->bytes + lVar2 * 2);
    lVar2 = lVar2 + 8;
  }
  free(cache);
  return;
}

Assistant:

void
msd_A_adaptive(unsigned char** strings, size_t N)
{
	cacheblock_t* cache = (cacheblock_t*) malloc(N*sizeof(cacheblock_t));
	for (size_t i=0; i < N; ++i) cache[i].ptr = strings[i];
	fill_cache(cache, N, 0);
	msd_A_adaptive(cache, N, 0, 0);
	for (size_t i=0; i < N; ++i) strings[i] = cache[i].ptr;
	free(cache);
}